

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O0

void __thiscall Dashel::Stream::fail(Stream *this,Source s,int se,char *reason)

{
  int *piVar1;
  char *pcVar2;
  DashelException *this_00;
  string local_40 [8];
  string sysMessage;
  char *reason_local;
  int se_local;
  Source s_local;
  Stream *this_local;
  
  sysMessage.field_2._8_8_ = reason;
  std::__cxx11::string::string(local_40);
  this->failedFlag = true;
  if (se != 0) {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    std::__cxx11::string::operator=(local_40,pcVar2);
  }
  std::__cxx11::string::operator=((string *)&this->failReason,(char *)sysMessage.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)&this->failReason," ");
  std::__cxx11::string::operator+=((string *)&this->failReason,local_40);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  DashelException::DashelException(this_00,s,se,pcVar2,this);
  __cxa_throw(this_00,&DashelException::typeinfo,DashelException::~DashelException);
}

Assistant:

void Stream::fail(DashelException::Source s, int se, const char* reason)
	{
		string sysMessage;
		failedFlag = true;

		if (se)
			sysMessage = strerror(errno);

		failReason = reason;
		failReason += " ";
		failReason += sysMessage;

		throw DashelException(s, se, failReason.c_str(), this);
	}